

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_strchr_internal.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  uint ret_7;
  char *str_7;
  uint ret_6;
  char *str_6;
  uint ret_5;
  char *str_5;
  uint ret_4;
  char *str_4;
  uint ret_3;
  char *str_3;
  uint ret_2;
  char *str_2;
  uint ret_1;
  char *str_1;
  uint ret;
  char *str;
  uint local_10;
  int fails;
  int passes;
  
  pcVar2 = host_strchr("[1:2:3]:4:5",0x3a);
  uVar1 = (int)pcVar2 - 0x102004;
  bVar4 = uVar1 != 7;
  if (bVar4) {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strchr","\"[1:2:3]:4:5\"","\':\'","-str",
           (ulong)uVar1,7);
  }
  local_10 = (uint)!bVar4;
  str._4_4_ = (uint)bVar4;
  pcVar2 = host_strrchr("[1:2:3]:4:5",0x3a);
  uVar1 = (int)pcVar2 - 0x102004;
  if (uVar1 == 9) {
    local_10 = local_10 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strrchr","\"[1:2:3]:4:5\"","\':\'","-str",
           (ulong)uVar1,9);
    str._4_4_ = str._4_4_ + 1;
  }
  sVar3 = host_strcspn("[1:2:3]:4:5","/:");
  if ((int)sVar3 == 7) {
    local_10 = local_10 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strcspn","\"[1:2:3]:4:5\"","\"/:\"","",
           sVar3 & 0xffffffff,7);
    str._4_4_ = str._4_4_ + 1;
  }
  pcVar2 = host_strchr("[1:2:3]",0x3a);
  if ((pcVar2 == (char *)0x0) == 1) {
    local_10 = local_10 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strchr","\"[1:2:3]\"","\':\'","== NULL",
           (ulong)(uint)(pcVar2 == (char *)0x0),1);
    str._4_4_ = str._4_4_ + 1;
  }
  pcVar2 = host_strrchr("[1:2:3]",0x3a);
  if ((pcVar2 == (char *)0x0) == 1) {
    local_10 = local_10 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strrchr","\"[1:2:3]\"","\':\'","== NULL",
           (ulong)(uint)(pcVar2 == (char *)0x0),1);
    str._4_4_ = str._4_4_ + 1;
  }
  sVar3 = host_strcspn("[1:2:3]","/:");
  if ((int)sVar3 == 7) {
    local_10 = local_10 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strcspn","\"[1:2:3]\"","\"/:\"","",
           sVar3 & 0xffffffff,7);
    str._4_4_ = str._4_4_ + 1;
  }
  sVar3 = host_strcspn("[1:2/3]","/:");
  if ((int)sVar3 == 4) {
    local_10 = local_10 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strcspn","\"[1:2/3]\"","\"/:\"","",
           sVar3 & 0xffffffff,4);
    str._4_4_ = str._4_4_ + 1;
  }
  sVar3 = host_strcspn("[1:2:3]/","/:");
  if ((int)sVar3 == 7) {
    local_10 = local_10 + 1;
  }
  else {
    printf("fail: %s(%s,%s)%s = %u, expected %u\n","host_strcspn","\"[1:2:3]/\"","\"/:\"","",
           sVar3 & 0xffffffff,7);
    str._4_4_ = str._4_4_ + 1;
  }
  printf("passed %d failed %d total %d\n",(ulong)local_10,(ulong)str._4_4_,
         (ulong)(local_10 + str._4_4_));
  return (uint)(str._4_4_ != 0);
}

Assistant:

int main(void)
{
    int passes = 0, fails = 0;

#define TEST1(func, string, arg2, suffix, result) do                    \
    {                                                                   \
        const char *str = string;                                       \
        unsigned ret = func(str, arg2) suffix;                          \
        if (ret == result) {                                            \
            passes++;                                                   \
        } else {                                                        \
            printf("fail: %s(%s,%s)%s = %u, expected %u\n",             \
                   #func, #string, #arg2, #suffix, ret,                 \
                   (unsigned)result);                                   \
            fails++;                                                    \
        }                                                               \
} while (0)

    TEST1(host_strchr, "[1:2:3]:4:5", ':', -str, 7);
    TEST1(host_strrchr, "[1:2:3]:4:5", ':', -str, 9);
    TEST1(host_strcspn, "[1:2:3]:4:5", "/:",, 7);
    TEST1(host_strchr, "[1:2:3]", ':', == NULL, 1);
    TEST1(host_strrchr, "[1:2:3]", ':', == NULL, 1);
    TEST1(host_strcspn, "[1:2:3]", "/:",, 7);
    TEST1(host_strcspn, "[1:2/3]", "/:",, 4);
    TEST1(host_strcspn, "[1:2:3]/", "/:",, 7);

    printf("passed %d failed %d total %d\n", passes, fails, passes+fails);
    return fails != 0 ? 1 : 0;
}